

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

cmGlobalGenerator * __thiscall cmake::CreateGlobalGenerator(cmake *this,string *gname)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  cmExternalMakefileProjectGenerator *extraGenerator;
  int iVar3;
  undefined4 extraout_var;
  cmGlobalGenerator *this_00;
  undefined4 extraout_var_01;
  undefined8 uVar4;
  cmake *pcVar5;
  string *globalGenerator;
  pointer ppcVar6;
  pointer ppcVar7;
  bool bVar8;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generators;
  pair<cmExternalMakefileProjectGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extra;
  string local_b8;
  cmake *local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  cmExternalMakefileProjectGenerator *local_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  undefined4 extraout_var_00;
  
  ppcVar7 = (this->ExtraGenerators).
            super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_98 = this;
  if (ppcVar7 !=
      (this->ExtraGenerators).
      super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
                (&local_90,*ppcVar7);
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_b8,*ppcVar7);
      _Var2._M_p = local_b8._M_dataplus._M_p;
      if (local_b8._M_string_length == gname->_M_string_length) {
        if (local_b8._M_string_length == 0) {
          bVar8 = true;
        }
        else {
          iVar3 = bcmp(local_b8._M_dataplus._M_p,(gname->_M_dataplus)._M_p,local_b8._M_string_length
                      );
          bVar8 = iVar3 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_b8.field_2) {
        operator_delete(_Var2._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      globalGenerator =
           local_90.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if (bVar8) {
        iVar3 = (*(*ppcVar7)->_vptr_cmExternalMakefileProjectGeneratorFactory[2])();
        pcVar5 = local_98;
        local_78 = (cmExternalMakefileProjectGenerator *)CONCAT44(extraout_var_01,iVar3);
        if (local_90.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_90.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar4 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0,0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_90);
          _Unwind_Resume(uVar4);
        }
        local_70 = local_60;
        pcVar1 = ((local_90.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar1,
                   pcVar1 + (local_90.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
LAB_002ff2f6:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_90);
        goto LAB_002ff300;
      }
      for (; globalGenerator !=
             local_90.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; globalGenerator = globalGenerator + 1) {
        cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_50,*ppcVar7);
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  (&local_b8,globalGenerator,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        _Var2._M_p = local_b8._M_dataplus._M_p;
        if ((local_b8._M_string_length == gname->_M_string_length) &&
           ((local_b8._M_string_length == 0 ||
            (iVar3 = bcmp(local_b8._M_dataplus._M_p,(gname->_M_dataplus)._M_p,
                          local_b8._M_string_length), iVar3 == 0)))) {
          iVar3 = (*(*ppcVar7)->_vptr_cmExternalMakefileProjectGeneratorFactory[2])();
          local_78 = (cmExternalMakefileProjectGenerator *)CONCAT44(extraout_var,iVar3);
          local_70 = local_60;
          pcVar1 = (globalGenerator->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar1,pcVar1 + globalGenerator->_M_string_length);
          pcVar5 = local_98;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_002ff2f6;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var2._M_p != &local_b8.field_2) {
          operator_delete(_Var2._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_90);
      ppcVar7 = ppcVar7 + 1;
    } while (ppcVar7 !=
             (local_98->ExtraGenerators).
             super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_78 = (cmExternalMakefileProjectGenerator *)0x0;
  local_70 = local_60;
  pcVar1 = (gname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + gname->_M_string_length);
  pcVar5 = local_98;
LAB_002ff300:
  extraGenerator = local_78;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_70,local_68 + (long)local_70);
  ppcVar6 = (pcVar5->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar6 !=
      (pcVar5->Generators).
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      iVar3 = (*(*ppcVar6)->_vptr_cmGlobalGeneratorFactory[2])(*ppcVar6,&local_b8,pcVar5);
      this_00 = (cmGlobalGenerator *)CONCAT44(extraout_var_00,iVar3);
      if (this_00 != (cmGlobalGenerator *)0x0) {
        cmGlobalGenerator::SetExternalMakefileProjectGenerator(this_00,extraGenerator);
        goto LAB_002ff36f;
      }
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 !=
             (pcVar5->Generators).
             super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (extraGenerator != (cmExternalMakefileProjectGenerator *)0x0) {
    (*extraGenerator->_vptr_cmExternalMakefileProjectGenerator[1])(extraGenerator);
  }
  this_00 = (cmGlobalGenerator *)0x0;
LAB_002ff36f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return this_00;
}

Assistant:

cmGlobalGenerator* cmake::CreateGlobalGenerator(const std::string& gname)
{
  std::pair<cmExternalMakefileProjectGenerator*, std::string> extra =
    createExtraGenerator(this->ExtraGenerators, gname);
  cmExternalMakefileProjectGenerator* extraGenerator = extra.first;
  const std::string name = extra.second;

  cmGlobalGenerator* generator = CM_NULLPTR;
  for (RegisteredGeneratorsVector::const_iterator i = this->Generators.begin();
       i != this->Generators.end(); ++i) {
    generator = (*i)->CreateGlobalGenerator(name, this);
    if (generator) {
      break;
    }
  }

  if (generator) {
    generator->SetExternalMakefileProjectGenerator(extraGenerator);
  } else {
    delete extraGenerator;
  }

  return generator;
}